

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O1

int test(char *URL)

{
  bool bVar1;
  int iVar2;
  CURLUcode CVar3;
  CURLUcode CVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  redircase *prVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  setcase *psVar15;
  querycase *pqVar16;
  char *url_2;
  char *url;
  char part [80];
  int local_150;
  CURLUcode local_13c;
  char *local_138;
  char *local_130;
  char *local_128 [10];
  undefined4 local_d8;
  char cStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  char local_d0;
  undefined4 local_88;
  char local_84;
  
  uVar5 = curl_url();
  iVar2 = curl_url_set(uVar5,0,"https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b1,iVar2);
  }
  uVar10 = (uint)(iVar2 != 0);
  iVar2 = curl_url_get(uVar5,5,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b8,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_set(uVar5,5,"[::1]",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3c3,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_get(uVar5,0,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ca,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_set(uVar5,5,"example.com",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3d5,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_get(uVar5,0,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3dc,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_set(uVar5,5,"[fe80::20c:29ff:fe9c:409b%25eth0]",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,1000,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_get(uVar5,0,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ef,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_get(uVar5,5,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3fa,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_get(uVar5,10,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x405,iVar2);
    uVar10 = uVar10 + 1;
  }
  iVar2 = curl_url_set(uVar5,10,"clown",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x410,iVar2);
    uVar10 = 1;
  }
  iVar2 = curl_url_get(uVar5,0,local_128,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",local_128[0]);
    curl_free(local_128[0]);
    curl_url_cleanup(uVar5);
    iVar2 = 6;
    if (uVar10 == 0) {
      pcVar14 = "HTTP://test/?s";
      pqVar16 = append_list;
      iVar11 = 0;
      do {
        pqVar16 = pqVar16 + 1;
        lVar6 = curl_url();
        if (lVar6 == 0) {
          iVar11 = 1;
        }
        else {
          CVar3 = curl_url_set(lVar6,0,pcVar14,pqVar16[-1].urlflags);
          if (CVar3 == CURLUE_OK) {
            CVar3 = curl_url_set(lVar6,8,pqVar16[-1].q,pqVar16[-1].qflags | 0x100);
          }
          else {
            iVar11 = 1;
          }
          if (iVar11 == 0) {
            CVar4 = pqVar16[-1].ucode;
            if (CVar3 == CVar4) {
              iVar11 = 0;
              if (CVar4 == CURLUE_OK) {
                CVar4 = curl_url_get(lVar6,0,local_128,0);
                if (CVar4 != CURLUE_OK) {
                  pcVar12 = "%s:%d Get URL returned %d\n";
                  pcVar14 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ;
                  CVar3 = 0x397;
                  goto LAB_00104733;
                }
                iVar11 = checkurl(local_128[0],pqVar16[-1].out);
                curl_free(local_128[0]);
              }
            }
            else {
              pcVar12 = "Append\nin: %s\nreturned %d (expected %d)\n";
LAB_00104733:
              curl_mfprintf(_stderr,pcVar12,pcVar14,CVar3,CVar4);
              iVar11 = 1;
            }
          }
          curl_url_cleanup(lVar6);
        }
      } while (((lVar6 != 0) && (pcVar14 = pqVar16->in, pcVar14 != (char *)0x0)) && (iVar11 == 0));
      iVar2 = 5;
      if (iVar11 == 0) {
        pcVar14 = "file://localhost/path?query#frag";
        prVar9 = set_url_list;
        bVar1 = false;
        do {
          prVar9 = prVar9 + 1;
          lVar6 = curl_url();
          if (lVar6 != 0) {
            CVar3 = curl_url_set(lVar6,0,pcVar14,prVar9[-1].urlflags);
            if (CVar3 == CURLUE_OK) {
              pcVar14 = prVar9[-1].set;
              iVar2 = curl_url_set(lVar6,0,pcVar14,prVar9[-1].setflags);
              if (iVar2 != 0) {
                curl_mfprintf(_stderr,"%s:%d Set URL %s returned %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                              ,0x2cd,pcVar14,iVar2);
                goto LAB_00104835;
              }
              local_128[0] = (char *)0x0;
              iVar2 = curl_url_get(lVar6,0,local_128,0);
              if (iVar2 == 0) {
                iVar2 = checkurl(local_128[0],prVar9[-1].out);
                if (iVar2 != 0) {
                  bVar1 = true;
                }
              }
              else {
                curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                              ,0x2d6,iVar2);
                bVar1 = true;
              }
              curl_free(local_128[0]);
            }
            else if (CVar3 != prVar9[-1].ucode) {
              curl_mfprintf(_stderr,"Set URL\nin: %s\nreturned %d (expected %d)\n",pcVar14,CVar3);
LAB_00104835:
              bVar1 = true;
            }
            curl_url_cleanup(lVar6);
          }
        } while (((lVar6 != 0) && (pcVar14 = prVar9->in, pcVar14 != (char *)0x0)) && (!bVar1));
        iVar2 = 1;
        if (!bVar1) {
          local_138 = "scheme=bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbc,";
          lVar6 = 0;
          psVar15 = set_parts_list;
          local_150 = 0;
          do {
            lVar7 = curl_url();
            if (lVar7 == 0) {
              local_150 = 1;
            }
            else {
              pcVar14 = psVar15->in;
              if (pcVar14 == (char *)0x0) {
                CVar3 = CURLUE_OK;
              }
              else {
                CVar3 = curl_url_set(lVar7,0,pcVar14,psVar15->urlflags);
              }
              if (CVar3 == CURLUE_OK) {
                local_130 = (char *)0x0;
                uVar10 = psVar15->setflags;
                pcVar14 = local_138;
                do {
                  pcVar12 = strchr(pcVar14,0x2c);
                  if (pcVar12 == (char *)0x0) {
                    iVar2 = 3;
                    CVar3 = local_13c;
                  }
                  else {
                    memcpy(local_128,pcVar14,(long)pcVar12 - (long)pcVar14);
                    *(undefined1 *)((long)local_128 + ((long)pcVar12 - (long)pcVar14)) = 0;
                    iVar2 = __isoc99_sscanf(local_128,"%79[^=]=%79[^,]",&local_d8,&local_88);
                    if (iVar2 == 2) {
                      uVar13 = 0;
                      if (local_d8 != 0x6c7275) {
                        if (CONCAT13(uStack_d2,
                                     CONCAT12(uStack_d3,CONCAT11(cStack_d4,local_d8._3_1_))) ==
                            0x656d65 && local_d8 == 0x65686373) {
                          uVar13 = 1;
                        }
                        else if (cStack_d4 == '\0' && local_d8 == 0x72657375) {
                          uVar13 = 2;
                        }
                        else if (local_d0 == '\0' &&
                                 CONCAT17(uStack_d1,
                                          CONCAT16(uStack_d2,
                                                   CONCAT15(uStack_d3,CONCAT14(cStack_d4,local_d8)))
                                         ) == 0x64726f7773736170) {
                          uVar13 = 3;
                        }
                        else {
                          uVar13 = 4;
                          if (CONCAT17(uStack_d1,
                                       CONCAT16(uStack_d2,
                                                CONCAT15(uStack_d3,CONCAT14(cStack_d4,local_d8))))
                              != 0x736e6f6974706f) {
                            if (cStack_d4 == '\0' && local_d8 == 0x74736f68) {
                              uVar13 = 5;
                            }
                            else if (cStack_d4 == '\0' && local_d8 == 0x74726f70) {
                              uVar13 = 6;
                            }
                            else if (cStack_d4 == '\0' && local_d8 == 0x68746170) {
                              uVar13 = 7;
                            }
                            else if (CONCAT11(uStack_d3,cStack_d4) == 0x79 && local_d8 == 0x72657571
                                    ) {
                              uVar13 = 8;
                            }
                            else if (local_d0 == '\0' &&
                                     CONCAT17(uStack_d1,
                                              CONCAT16(uStack_d2,
                                                       CONCAT15(uStack_d3,
                                                                CONCAT14(cStack_d4,local_d8)))) ==
                                     0x746e656d67617266) {
                              uVar13 = 9;
                            }
                            else {
                              uVar13 = 9999;
                              if (CONCAT13(uStack_d2,
                                           CONCAT12(uStack_d3,CONCAT11(cStack_d4,local_d8._3_1_)))
                                  == 0x646965 && local_d8 == 0x656e6f7a) {
                                uVar13 = 10;
                              }
                            }
                          }
                        }
                      }
                      if (10 < uVar13) {
                        curl_mfprintf(_stderr,"UNKNOWN part \'%s\'\n",&local_d8);
                      }
                      if (local_84 == '\0' && local_88 == 0x4c4c554e) {
                        pcVar8 = (char *)0x0;
                      }
                      else if (local_88._2_1_ == '\0' && (short)local_88 == 0x2222) {
                        pcVar8 = "";
                      }
                      else {
                        pcVar8 = (char *)&local_88;
                      }
                      CVar3 = curl_url_set(lVar7,uVar13,pcVar8,uVar10);
                      iVar2 = 1;
                      if (CVar3 != CURLUE_OK) goto LAB_00104c41;
                    }
                    pcVar14 = pcVar12 + 1;
                    iVar2 = 2;
                    CVar3 = local_13c;
                  }
LAB_00104c41:
                  local_13c = CVar3;
                } while (iVar2 == 2);
                CVar3 = local_13c;
                if (iVar2 == 3) {
                  CVar3 = CURLUE_OK;
                }
                if (CVar3 != psVar15->pcode) {
                  curl_mfprintf(_stderr,"updateurl\nin: %s\nreturned %d (expected %d)\n",local_138);
                  local_150 = 1;
                }
                iVar2 = curl_url_get(lVar7,0,&local_130,0);
                if (iVar2 == 0) {
                  iVar2 = checkurl(local_130,psVar15->out);
                  local_150 = local_150 + iVar2;
                }
                else {
                  curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                                ,0x30b,iVar2);
                  local_150 = local_150 + 1;
                }
                curl_free(local_130);
              }
              else if (CVar3 != psVar15->ucode) {
                curl_mfprintf(_stderr,"Set parts\nin: %s\nreturned %d (expected %d)\n",pcVar14,CVar3
                             );
                local_150 = 1;
              }
              curl_url_cleanup(lVar7);
            }
            if (lVar7 == 0) {
LAB_00104d3e:
              if (local_150 != 0) {
                return 2;
              }
              iVar2 = get_url();
              if (iVar2 != 0) {
                return 3;
              }
              iVar2 = get_parts();
              if (iVar2 != 0) {
                return 4;
              }
              curl_mprintf("success\n");
              return 0;
            }
            lVar6 = lVar6 + 1;
            local_138 = set_parts_list[lVar6].set;
            if ((local_138 == (char *)0x0) || (psVar15 = set_parts_list + lVar6, local_150 != 0))
            goto LAB_00104d3e;
          } while( true );
        }
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x417,iVar2);
    curl_url_cleanup(uVar5);
    iVar2 = 6;
  }
  return iVar2;
}

Assistant:

static int scopeid(void)
{
  CURLU *u = curl_url();
  int error = 0;
  CURLUcode rc;
  char *url;

  rc = curl_url_set(u, CURLUPART_URL,
                    "https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "[::1]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "example.com", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST,
                    "[fe80::20c:29ff:fe9c:409b%25eth0]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_ZONEID, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_ZONEID, "clown", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  curl_url_cleanup(u);

  return error;
}